

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O3

int32_t conv_mcnp6_pdg2ssw(int32_t c)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int32_t *piVar5;
  long lVar6;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if (uVar1 < 0x3b9b1849) {
    uVar2 = 7;
    if (c == -0xb) goto LAB_00103ad3;
    piVar5 = conv_mcnp6_to_pdg_0to36;
    uVar2 = 0;
    do {
      if (*piVar5 == c) goto LAB_00103ad3;
      uVar2 = uVar2 + 2;
      piVar5 = piVar5 + 1;
    } while (uVar2 != 0x4a);
    uVar2 = 1;
    lVar6 = 0;
    do {
      if (*(uint *)((long)conv_mcnp6_to_pdg_0to36 + lVar6) == -c) goto LAB_00103ad3;
      uVar2 = (ulong)((int)uVar2 + 2);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x94);
  }
  uVar2 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar4 = uVar1 / 10 + (uVar1 / 10000) * -1000;
    iVar3 = uVar1 / 10000 + (uVar1 / 10000000) * -1000;
    if (iVar3 - 1U < uVar4) {
      uVar2 = (ulong)(iVar3 * 0x10000 + ((uVar1 % 10) * 0x800000 | (uint)c >> 0x1f | uVar4 * 0x80) +
                     0x4a);
    }
  }
LAB_00103ad3:
  return (int32_t)uVar2;
}

Assistant:

int32_t conv_mcnp6_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    if (c==-11)
      return 7;//e+ is special case, pick 7 (anti e-) rather than 16 (straight e+)
    int i;
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i]==c)
        return 2*i;
    }
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i] == -c)
        return 1 + 2*i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( !A || !Z || Z>A )
      return 0;
    int32_t res = (c<0?1:0);
    res += 2*37;
    res += 128*A;
    res += 128*512*Z;
    res += 128*512*128*I;
    return res;
  }
  return 0;
}